

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O2

bool __thiscall
deqp::ShaderIntegerMixRenderCase::probe_pixel
          (ShaderIntegerMixRenderCase *this,TestLog *log,char *stage,int x,int y,IVec4 *expected)

{
  ostringstream *this_00;
  bool bVar1;
  IVec4 pixel;
  undefined1 local_1b0 [384];
  
  tcu::Vector<int,_4>::Vector(&pixel);
  glwReadPixels(x,y,1,1,0x8d99,0x1404,&pixel);
  bVar1 = tcu::Vector<int,_4>::operator!=(expected,&pixel);
  if (bVar1) {
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,stage);
    std::operator<<((ostream *)this_00," shader failed at pixel (");
    std::ostream::operator<<(this_00,x);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,y);
    std::operator<<((ostream *)this_00,").  ");
    std::operator<<((ostream *)this_00,"Got ");
    tcu::operator<<((ostream *)this_00,&pixel);
    std::operator<<((ostream *)this_00,", expected ");
    tcu::operator<<((ostream *)this_00,expected);
    std::operator<<((ostream *)this_00,").");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return !bVar1;
}

Assistant:

bool probe_pixel(TestLog& log, const char* stage, int x, int y, const tcu::IVec4& expected)
	{
		tcu::IVec4 pixel;

		glReadPixels(x, y, 1, 1, GL_RGBA_INTEGER, GL_INT, &pixel);

		if (expected != pixel)
		{
			log << TestLog::Message << stage << " shader failed at pixel (" << x << ", " << y << ").  "
				<< "Got " << pixel << ", expected " << expected << ")." << TestLog::EndMessage;
			return false;
		}

		return true;
	}